

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

DefinitionLookupResult * __thiscall
slang::ast::Compilation::getDefinition
          (DefinitionLookupResult *__return_storage_ptr__,Compilation *this,string_view name,
          Scope *scope,SourceRange sourceRange,BindDirectiveInfo *bindInfo)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  ModuleDeclarationSyntax *syntax;
  ulong uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  SyntaxNode *syntax_00;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  DefinitionSymbol *pDVar9;
  ConfigRule *pCVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  value_type *elements_1;
  ulong uVar16;
  value_type *elements;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  __return_storage_ptr__->configRule = (ConfigRule *)0x0;
  __return_storage_ptr__->definition = (Symbol *)0x0;
  __return_storage_ptr__->configRoot = (ConfigBlockSymbol *)0x0;
  syntax = (ModuleDeclarationSyntax *)bindInfo->instantiationDefSyntax;
  if (syntax != (ModuleDeclarationSyntax *)0x0) {
    if ((syntax->super_MemberSyntax).super_SyntaxNode.kind == UdpDeclaration) {
      Scope::addDiag(scope,(DiagCode)0xa0006,sourceRange);
      goto LAB_00140326;
    }
    pDVar9 = getDefinition(this,scope,syntax);
    __return_storage_ptr__->definition = &pDVar9->super_Symbol;
    if (pDVar9 != (DefinitionSymbol *)0x0) goto LAB_00140326;
  }
  errorMissingDef(this,name,scope,sourceRange,(DiagCode)0xcf0006);
LAB_00140326:
  auVar7._8_8_ = 0;
  auVar7._0_8_ = bindInfo->configBlockSyntax;
  uVar12 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar3 = (this->configBySyntax).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
          .arrays.groups_size_mask;
  bVar11 = (byte)(this->configBySyntax).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                 .arrays.groups_size_index;
  uVar14 = uVar12 >> (bVar11 & 0x3f);
  pgVar4 = (this->configBySyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           .arrays.groups_;
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar12 & 0xff];
  ppVar5 = (this->configBySyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           .arrays.elements_;
  uVar16 = 0;
  do {
    pgVar1 = pgVar4 + uVar14;
    uVar17 = (uchar)uVar2;
    auVar21[0] = -(pgVar1->m[0].n == uVar17);
    uVar18 = (uchar)((uint)uVar2 >> 8);
    auVar21[1] = -(pgVar1->m[1].n == uVar18);
    uVar19 = (uchar)((uint)uVar2 >> 0x10);
    auVar21[2] = -(pgVar1->m[2].n == uVar19);
    uVar20 = (uchar)((uint)uVar2 >> 0x18);
    auVar21[3] = -(pgVar1->m[3].n == uVar20);
    auVar21[4] = -(pgVar1->m[4].n == uVar17);
    auVar21[5] = -(pgVar1->m[5].n == uVar18);
    auVar21[6] = -(pgVar1->m[6].n == uVar19);
    auVar21[7] = -(pgVar1->m[7].n == uVar20);
    auVar21[8] = -(pgVar1->m[8].n == uVar17);
    auVar21[9] = -(pgVar1->m[9].n == uVar18);
    auVar21[10] = -(pgVar1->m[10].n == uVar19);
    auVar21[0xb] = -(pgVar1->m[0xb].n == uVar20);
    auVar21[0xc] = -(pgVar1->m[0xc].n == uVar17);
    auVar21[0xd] = -(pgVar1->m[0xd].n == uVar18);
    auVar21[0xe] = -(pgVar1->m[0xe].n == uVar19);
    auVar21[0xf] = -(pgVar1->m[0xf].n == uVar20);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
        uVar13 = uVar13 - 1 & uVar13) {
      iVar6 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (bindInfo->configBlockSyntax ==
          *(SyntaxNode **)((long)&ppVar5[uVar14 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
        lVar15 = (long)&ppVar5[uVar14 * 0xf].first + (ulong)(uint)(iVar6 << 4);
        goto LAB_0014040e;
      }
    }
    if ((pgVar4[uVar14].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7]) == 0) break;
    lVar15 = uVar14 + uVar16;
    uVar16 = uVar16 + 1;
    uVar14 = lVar15 + 1U & uVar3;
  } while (uVar16 <= uVar3);
  lVar15 = 0;
LAB_0014040e:
  if (lVar15 != 0) {
    __return_storage_ptr__->configRoot = *(ConfigBlockSymbol **)(lVar15 + 8);
  }
  syntax_00 = bindInfo->configRuleSyntax;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = syntax_00;
  uVar14 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar12 = uVar14 >> (bVar11 & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar14 & 0xff];
  uVar3 = (this->configBySyntax).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
          .arrays.groups_size_mask;
  ppVar5 = (this->configBySyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           .arrays.elements_;
  uVar16 = 0;
  do {
    pgVar1 = pgVar4 + uVar12;
    uVar17 = (uchar)uVar2;
    auVar22[0] = -(pgVar1->m[0].n == uVar17);
    uVar18 = (uchar)((uint)uVar2 >> 8);
    auVar22[1] = -(pgVar1->m[1].n == uVar18);
    uVar19 = (uchar)((uint)uVar2 >> 0x10);
    auVar22[2] = -(pgVar1->m[2].n == uVar19);
    uVar20 = (uchar)((uint)uVar2 >> 0x18);
    auVar22[3] = -(pgVar1->m[3].n == uVar20);
    auVar22[4] = -(pgVar1->m[4].n == uVar17);
    auVar22[5] = -(pgVar1->m[5].n == uVar18);
    auVar22[6] = -(pgVar1->m[6].n == uVar19);
    auVar22[7] = -(pgVar1->m[7].n == uVar20);
    auVar22[8] = -(pgVar1->m[8].n == uVar17);
    auVar22[9] = -(pgVar1->m[9].n == uVar18);
    auVar22[10] = -(pgVar1->m[10].n == uVar19);
    auVar22[0xb] = -(pgVar1->m[0xb].n == uVar20);
    auVar22[0xc] = -(pgVar1->m[0xc].n == uVar17);
    auVar22[0xd] = -(pgVar1->m[0xd].n == uVar18);
    auVar22[0xe] = -(pgVar1->m[0xe].n == uVar19);
    auVar22[0xf] = -(pgVar1->m[0xf].n == uVar20);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
        uVar13 = uVar13 - 1 & uVar13) {
      iVar6 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (syntax_00 ==
          *(SyntaxNode **)((long)&ppVar5[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
        lVar15 = (long)&ppVar5[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4);
        goto LAB_001404f0;
      }
    }
    if ((pgVar4[uVar12].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7]) == 0) break;
    lVar15 = uVar12 + uVar16;
    uVar16 = uVar16 + 1;
    uVar12 = lVar15 + 1U & uVar3;
  } while (uVar16 <= uVar3);
  lVar15 = 0;
LAB_001404f0:
  if (lVar15 != 0) {
    pCVar10 = ConfigBlockSymbol::findRuleFromSyntax(*(ConfigBlockSymbol **)(lVar15 + 8),syntax_00);
    __return_storage_ptr__->configRule = pCVar10;
  }
  return __return_storage_ptr__;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::getDefinition(
    std::string_view name, const Scope& scope, SourceRange sourceRange,
    const BindDirectiveInfo& bindInfo) const {

    DefinitionLookupResult result;
    if (bindInfo.instantiationDefSyntax) {
        switch (bindInfo.instantiationDefSyntax->kind) {
            case SyntaxKind::ModuleDeclaration:
            case SyntaxKind::InterfaceDeclaration:
            case SyntaxKind::ProgramDeclaration: {
                auto& mds = bindInfo.instantiationDefSyntax->as<ModuleDeclarationSyntax>();
                result.definition = getDefinition(scope, mds);
                if (!result.definition)
                    errorMissingDef(name, scope, sourceRange, diag::UnknownModule);
                break;
            }
            case SyntaxKind::UdpDeclaration:
                scope.addDiag(diag::BindTargetPrimitive, sourceRange);
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }
    else {
        errorMissingDef(name, scope, sourceRange, diag::UnknownModule);
    }

    if (auto it = configBySyntax.find(bindInfo.configBlockSyntax); it != configBySyntax.end())
        result.configRoot = it->second;

    if (auto it = configBySyntax.find(bindInfo.configRuleSyntax); it != configBySyntax.end()) {
        // This rule maps to a config block, so map further to the actual rule object.
        result.configRule = it->second->findRuleFromSyntax(*bindInfo.configRuleSyntax);
    }

    return result;
}